

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extpubkey.cpp
# Opt level: O3

void __thiscall
ExtPubkey_CreateExtPubkeyFromPubkey_Test::TestBody(ExtPubkey_CreateExtPubkeyFromPubkey_Test *this)

{
  undefined1 *puVar1;
  bool bVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  char *pcVar5;
  char *in_R9;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_3;
  ExtPubkey extkey;
  string local_1a8;
  string local_188;
  undefined1 local_168 [40];
  ByteData256 local_140;
  ByteData local_128;
  bool local_110;
  undefined3 uStack_10f;
  NetType NStack_10c;
  ByteData local_108;
  ByteData256 local_f0;
  Pubkey local_d8;
  ByteData256 local_c0;
  Extkey local_a8;
  
  cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)&local_a8);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a8,
                 "02ca30dbb25a2cf96344a04ae2144fb28a17f006c34cfb973b9f21623db27c5cd3","");
      cfd::core::Pubkey::Pubkey(&local_d8,&local_1a8);
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_188,
                 "87ced156b5641d416892046bbd1257c492c030967868aa8dc7a7067490fa08d5","");
      cfd::core::ByteData256::ByteData256(&local_c0,&local_188);
      in_R9 = (char *)0x2c;
      cfd::core::ExtPubkey::ExtPubkey
                ((ExtPubkey *)local_168,kTestnet,&local_d8,&local_c0,'\x03',0x2c,kNormal);
      local_a8.version_ = local_168._0_4_;
      cfd::core::ByteData::operator=(&local_a8.fingerprint_,(ByteData *)(local_168 + 8));
      local_a8.depth_ = local_168[0x20];
      local_a8._33_3_ = local_168._33_3_;
      local_a8.child_num_ = local_168._36_4_;
      cfd::core::ByteData256::operator=(&local_a8.chaincode_,&local_140);
      cfd::core::ByteData::operator=(&local_a8.privkey_.data_,&local_128);
      local_a8.privkey_.is_compressed_ = local_110;
      local_a8.privkey_._25_3_ = uStack_10f;
      local_a8.privkey_.net_type_ = NStack_10c;
      cfd::core::ByteData::operator=(&local_a8.pubkey_.data_,&local_108);
      cfd::core::ByteData256::operator=(&local_a8.tweak_sum_,&local_f0);
      if (local_f0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f0.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_f0.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_108.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_128.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_128.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_140.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_140.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_140.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_140.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_168._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_168._8_8_,local_168._24_8_ - local_168._8_8_);
      }
      if (local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c0.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c0.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if (local_d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,200,
               "Expected: (extkey = ExtPubkey(NetType::kTestnet, Pubkey(\"02ca30dbb25a2cf96344a04ae2144fb28a17f006c34cfb973b9f21623db27c5cd3\"), ByteData256(\"87ced156b5641d416892046bbd1257c492c030967868aa8dc7a7067490fa08d5\"), 3, 44)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
    if (CONCAT44(local_168._4_4_,local_168._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_168._4_4_,local_168._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_168._4_4_,local_168._0_4_) + 8))();
      }
    }
  }
  cfd::core::Extkey::GetData((ByteData *)&local_1a8,&local_a8);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_168,(ByteData *)&local_1a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_188,
             "\"043587cf04a53a8ff30000002c839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3\""
             ,"extkey.GetData().GetHex().c_str()",
             "043587cf04a53a8ff30000002c839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3"
             ,(char *)CONCAT44(local_168._4_4_,local_168._0_4_));
  puVar1 = local_168 + 0x10;
  if ((undefined1 *)CONCAT44(local_168._4_4_,local_168._0_4_) != puVar1) {
    operator_delete((undefined1 *)CONCAT44(local_168._4_4_,local_168._0_4_),
                    (ulong)(local_168._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_1a8._M_dataplus._M_p,
                    local_1a8.field_2._M_allocated_capacity - (long)local_1a8._M_dataplus._M_p);
  }
  if ((uint8_t)local_188._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_168);
    if ((undefined8 *)local_188._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_188._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xc9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
    if (CONCAT44(local_168._4_4_,local_168._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_168._4_4_,local_168._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_168._4_4_,local_168._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_188._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Extkey::ToString_abi_cxx11_((string *)local_168,&local_a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1a8,
             "\"tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua\""
             ,"extkey.ToString().c_str()",
             "tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua"
             ,(char *)CONCAT44(local_168._4_4_,local_168._0_4_));
  if ((undefined1 *)CONCAT44(local_168._4_4_,local_168._0_4_) != puVar1) {
    operator_delete((undefined1 *)CONCAT44(local_168._4_4_,local_168._0_4_),
                    (ulong)(local_168._16_8_ + 1));
  }
  if ((char)local_1a8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_168);
    if ((undefined8 *)local_1a8._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1a8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xca,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if (CONCAT44(local_168._4_4_,local_168._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_168._4_4_,local_168._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_168._4_4_,local_168._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1a8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Extkey::GetVersionData((ByteData *)&local_1a8,&local_a8);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_168,(ByteData *)&local_1a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_188,"\"043587cf\"","extkey.GetVersionData().GetHex().c_str()",
             "043587cf",(char *)CONCAT44(local_168._4_4_,local_168._0_4_));
  if ((undefined1 *)CONCAT44(local_168._4_4_,local_168._0_4_) != puVar1) {
    operator_delete((undefined1 *)CONCAT44(local_168._4_4_,local_168._0_4_),
                    (ulong)(local_168._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_1a8._M_dataplus._M_p,
                    local_1a8.field_2._M_allocated_capacity - (long)local_1a8._M_dataplus._M_p);
  }
  if ((uint8_t)local_188._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_168);
    if ((undefined8 *)local_188._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_188._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xcb,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
    if (CONCAT44(local_168._4_4_,local_168._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_168._4_4_,local_168._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_168._4_4_,local_168._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_188._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar4 = cfd::core::Extkey::GetVersion(&local_a8);
  local_1a8._M_dataplus._M_p._0_4_ = uVar4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_168,"extpubkey_kVersionTestnetPubkey","extkey.GetVersion()",
             &extpubkey_kVersionTestnetPubkey,(uint *)&local_1a8);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if ((pointer)local_168._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_168._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xcc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((long *)local_1a8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_1a8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_168 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar2 = cfd::core::Extkey::IsValid(&local_a8);
  local_1a8._M_dataplus._M_p._0_1_ = bVar2;
  local_1a8._M_string_length = 0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_168,(internal *)&local_1a8,(AssertionResult *)"extkey.IsValid()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xcd,(char *)CONCAT44(local_168._4_4_,local_168._0_4_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if ((undefined1 *)CONCAT44(local_168._4_4_,local_168._0_4_) != puVar1) {
      operator_delete((undefined1 *)CONCAT44(local_168._4_4_,local_168._0_4_),
                      (ulong)(local_168._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_188._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1a8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8._M_dataplus._M_p._0_4_ = 4;
  uVar3 = cfd::core::Extkey::GetDepth(&local_a8);
  local_188._M_dataplus._M_p._0_1_ = uVar3;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_168,"4","extkey.GetDepth()",(int *)&local_1a8,(uchar *)&local_188);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if ((pointer)local_168._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_168._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xce,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((long *)local_1a8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_1a8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_168 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Extkey::GetPubkey((Pubkey *)&local_1a8,&local_a8);
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_168,(Pubkey *)&local_1a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_188,
             "\"03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3\"",
             "extkey.GetPubkey().GetHex().c_str()",
             "03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3",
             (char *)CONCAT44(local_168._4_4_,local_168._0_4_));
  if ((undefined1 *)CONCAT44(local_168._4_4_,local_168._0_4_) != puVar1) {
    operator_delete((undefined1 *)CONCAT44(local_168._4_4_,local_168._0_4_),
                    (ulong)(local_168._16_8_ + 1));
  }
  if ((long *)local_1a8._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_1a8._M_dataplus._M_p,
                    local_1a8.field_2._M_allocated_capacity - (long)local_1a8._M_dataplus._M_p);
  }
  if ((uint8_t)local_188._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_168);
    if ((undefined8 *)local_188._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_188._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xcf,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
    if (CONCAT44(local_168._4_4_,local_168._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_168._4_4_,local_168._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_168._4_4_,local_168._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_188._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Extkey::GetChainCode((ByteData256 *)&local_1a8,&local_a8);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_168,(ByteData256 *)&local_1a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_188,
             "\"839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e\"",
             "extkey.GetChainCode().GetHex().c_str()",
             "839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e",
             (char *)CONCAT44(local_168._4_4_,local_168._0_4_));
  if ((undefined1 *)CONCAT44(local_168._4_4_,local_168._0_4_) != puVar1) {
    operator_delete((undefined1 *)CONCAT44(local_168._4_4_,local_168._0_4_),
                    (ulong)(local_168._16_8_ + 1));
  }
  if ((long *)local_1a8._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_1a8._M_dataplus._M_p,
                    local_1a8.field_2._M_allocated_capacity - (long)local_1a8._M_dataplus._M_p);
  }
  if ((uint8_t)local_188._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_168);
    if ((undefined8 *)local_188._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_188._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xd0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
    if (CONCAT44(local_168._4_4_,local_168._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_168._4_4_,local_168._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_168._4_4_,local_168._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_188._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Extkey::GetFingerprintData((ByteData *)&local_1a8,&local_a8);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_168,(ByteData *)&local_1a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_188,"\"a53a8ff3\"","extkey.GetFingerprintData().GetHex().c_str()",
             "a53a8ff3",(char *)CONCAT44(local_168._4_4_,local_168._0_4_));
  if ((undefined1 *)CONCAT44(local_168._4_4_,local_168._0_4_) != puVar1) {
    operator_delete((undefined1 *)CONCAT44(local_168._4_4_,local_168._0_4_),
                    (ulong)(local_168._16_8_ + 1));
  }
  if ((long *)local_1a8._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_1a8._M_dataplus._M_p,
                    local_1a8.field_2._M_allocated_capacity - (long)local_1a8._M_dataplus._M_p);
  }
  if ((uint8_t)local_188._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_168);
    if ((undefined8 *)local_188._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_188._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xd1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
    if (CONCAT44(local_168._4_4_,local_168._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_168._4_4_,local_168._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_168._4_4_,local_168._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_188._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_a8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.tweak_sum_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.tweak_sum_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.privkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.privkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.privkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.privkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.chaincode_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.chaincode_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.fingerprint_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.fingerprint_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.fingerprint_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.fingerprint_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(ExtPubkey, CreateExtPubkeyFromPubkey) {
  ExtPubkey extkey;

  EXPECT_NO_THROW((extkey = ExtPubkey(NetType::kTestnet,
      Pubkey("02ca30dbb25a2cf96344a04ae2144fb28a17f006c34cfb973b9f21623db27c5cd3"),
      ByteData256("87ced156b5641d416892046bbd1257c492c030967868aa8dc7a7067490fa08d5"),
      3, 44)));
  EXPECT_STREQ("043587cf04a53a8ff30000002c839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3", extkey.GetData().GetHex().c_str());
  EXPECT_STREQ("tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua", extkey.ToString().c_str());
  EXPECT_STREQ("043587cf", extkey.GetVersionData().GetHex().c_str());
  EXPECT_EQ(extpubkey_kVersionTestnetPubkey, extkey.GetVersion());
  EXPECT_TRUE(extkey.IsValid());
  EXPECT_EQ(4, extkey.GetDepth());
  EXPECT_STREQ("03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3", extkey.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e", extkey.GetChainCode().GetHex().c_str());
  EXPECT_STREQ("a53a8ff3", extkey.GetFingerprintData().GetHex().c_str());
}